

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O2

bool QCoreApplicationPrivate::notify_helper(QObject *receiver,QEvent *event)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = QThread::isMainThread();
  if ((QCoreApplication::self != (QCoreApplication *)0x0 && bVar1) &&
     (bVar1 = sendThroughApplicationEventFilters
                        ((QCoreApplicationPrivate *)(QCoreApplication::self->super_QObject).d_ptr.d,
                         receiver,event), bVar1)) {
    return true;
  }
  bVar1 = sendThroughObjectEventFilters(receiver,event);
  if (bVar1) {
    return true;
  }
  iVar2 = (*receiver->_vptr_QObject[5])(receiver,event);
  return SUB41(iVar2,0);
}

Assistant:

bool QCoreApplicationPrivate::notify_helper(QObject *receiver, QEvent * event)
{
    // Note: when adjusting the tracepoints in here
    // consider adjusting QApplicationPrivate::notify_helper too.
    Q_TRACE(QCoreApplication_notify_entry, receiver, event, event->type());
    bool consumed = false;
    bool filtered = false;
    Q_TRACE_EXIT(QCoreApplication_notify_exit, consumed, filtered);

    // send to all application event filters (only does anything in the main thread)
    if (QThread::isMainThread()
            && QCoreApplication::self
            && QCoreApplication::self->d_func()->sendThroughApplicationEventFilters(receiver, event)) {
        filtered = true;
        return filtered;
    }
    // send to all receiver event filters
    if (sendThroughObjectEventFilters(receiver, event)) {
        filtered = true;
        return filtered;
    }

    // deliver the event
    consumed = receiver->event(event);
    return consumed;
}